

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

PromiseCrossThreadFulfillerPair<void> * __thiscall
kj::Executor::newPromiseAndCrossThreadFulfiller<void>
          (PromiseCrossThreadFulfillerPair<void> *__return_storage_ptr__,Executor *this)

{
  Executor *pEVar1;
  XThreadPaf *this_00;
  CrossThreadPromiseFulfiller<void> *pCVar2;
  XThreadPafImpl<void> *ptrCopy;
  Own<const_kj::Executor,_std::nullptr_t> local_28;
  
  this_00 = (XThreadPaf *)operator_new(0x1e0);
  (**this->_vptr_Executor)(&local_28,this);
  kj::_::XThreadPaf::XThreadPaf(this_00,&local_28);
  pEVar1 = local_28.ptr;
  (this_00->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR_destroy_00608668;
  *(undefined1 *)&this_00[1].super_PromiseNode.super_PromiseArenaMember._vptr_PromiseArenaMember = 0
  ;
  *(undefined1 *)&this_00[7].executor.disposer = 0;
  if (local_28.ptr != (Executor *)0x0) {
    local_28.ptr = (Executor *)0x0;
    (**(local_28.disposer)->_vptr_Disposer)
              (local_28.disposer,
               (_func_int *)((long)&pEVar1->_vptr_Executor + (long)pEVar1->_vptr_Executor[-2]));
  }
  pCVar2 = (CrossThreadPromiseFulfiller<void> *)operator_new(0x10);
  (pCVar2->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_006086c8;
  pCVar2[1].super_PromiseFulfiller<void>.super_PromiseRejector._vptr_PromiseRejector =
       (_func_int **)this_00;
  (__return_storage_ptr__->promise).super_PromiseBase.node.ptr = (PromiseNode *)this_00;
  (__return_storage_ptr__->fulfiller).disposer =
       (Disposer *)&kj::_::HeapDisposer<kj::_::XThreadFulfiller<void>>::instance;
  (__return_storage_ptr__->fulfiller).ptr = pCVar2;
  return __return_storage_ptr__;
}

Assistant:

PromiseCrossThreadFulfillerPair<T> Executor::newPromiseAndCrossThreadFulfiller() const {
  kj::Own<_::XThreadPafImpl<T>, _::PromiseDisposer> node(new _::XThreadPafImpl<T>(addRef()));
  auto fulfiller = kj::heap<_::XThreadFulfiller<T>>(node);
  return { _::PromiseNode::to<_::ReducePromises<T>>(kj::mv(node)), kj::mv(fulfiller) };
}